

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t icu_63::calcExtNameSetsLengths(int32_t maxNameLength)

{
  int32_t iVar1;
  int local_10;
  int32_t length;
  int32_t i;
  int32_t maxNameLength_local;
  
  length = maxNameLength;
  for (local_10 = 0; local_10 < 0x21; local_10 = local_10 + 1) {
    iVar1 = calcStringSetLength((uint32_t *)gNameSet,*(char **)(charCatNames + (long)local_10 * 8));
    if (length < iVar1 + 9) {
      length = iVar1 + 9;
    }
  }
  return length;
}

Assistant:

static int32_t
calcExtNameSetsLengths(int32_t maxNameLength) {
    int32_t i, length;

    for(i=0; i<UPRV_LENGTHOF(charCatNames); ++i) {
        /*
         * for each category, count the length of the category name
         * plus 9=
         * 2 for <>
         * 1 for -
         * 6 for most hex digits per code point
         */
        length=9+calcStringSetLength(gNameSet, charCatNames[i]);
        if(length>maxNameLength) {
            maxNameLength=length;
        }
    }
    return maxNameLength;
}